

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
ot::commissioner::Interpreter::PrintNetworkMessage
          (Interpreter *this,string *alias,string *aMessage,Color aColor)

{
  string *aLine;
  allocator local_31;
  string local_30;
  
  aLine = (string *)std::__cxx11::string::append((char *)alias);
  Console::Write(aLine,kDefault);
  Console::Write(aMessage,aColor);
  std::__cxx11::string::string((string *)&local_30,"\n",&local_31);
  Console::Write(&local_30,kDefault);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Interpreter::PrintNetworkMessage(std::string alias, std::string aMessage, Console::Color aColor)
{
    Console::Write(alias.append(": "));
    Console::Write(aMessage, aColor);
    Console::Write("\n");
}